

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O1

void __thiscall
TCMallocImplementation::Ranges(TCMallocImplementation *this,void *arg,RangeFunction *func)

{
  undefined7 extraout_var;
  PageID start;
  ulong uVar1;
  MallocRange *pMVar2;
  bool bVar3;
  SpinLockHolder local_40;
  SpinLockHolder h;
  
  start = 1;
  h.lock_ = (SpinLock *)0x0;
  do {
    local_40.lock_ = (SpinLock *)(tcmalloc::Static::pageheap_ + 8);
    LOCK();
    bVar3 = tcmalloc::Static::pageheap_._8_4_ == 0;
    if (bVar3) {
      tcmalloc::Static::pageheap_._8_4_ = 1;
    }
    UNLOCK();
    if (!bVar3) {
      SpinLock::SlowLock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
    }
    pMVar2 = (MallocRange *)
             &IterateOverRanges(void*,void(*)(void*,base::MallocRange_const*))::ranges;
    uVar1 = 0;
    do {
      bVar3 = tcmalloc::PageHeap::GetNextRange((PageHeap *)tcmalloc::Static::pageheap_,start,pMVar2)
      ;
      if (!bVar3) {
        h.lock_ = (SpinLock *)CONCAT71(extraout_var,1);
        goto LAB_00110a5a;
      }
      start = pMVar2->address + pMVar2->length + 0x1fff >> 0xd;
      uVar1 = uVar1 + 1;
      pMVar2 = pMVar2 + 1;
    } while (uVar1 != 0x10);
    uVar1 = 0x10;
LAB_00110a5a:
    SpinLockHolder::~SpinLockHolder(&local_40);
    if ((int)uVar1 != 0) {
      uVar1 = uVar1 & 0xffffffff;
      pMVar2 = (MallocRange *)
               &IterateOverRanges(void*,void(*)(void*,base::MallocRange_const*))::ranges;
      do {
        (*func)(arg,pMVar2);
        pMVar2 = pMVar2 + 1;
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
    if (((ulong)h.lock_ & 1) != 0) {
      return;
    }
  } while( true );
}

Assistant:

virtual void Ranges(void* arg, RangeFunction func) {
    IterateOverRanges(arg, func);
  }